

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

graph * __thiscall mpt::convertable::operator_cast_to_graph_(convertable *this)

{
  uint uVar1;
  int iVar2;
  graph *ptr;
  
  uVar1 = type_properties<mpt::layout::graph_*>::id(true);
  ptr = (graph *)0x0;
  if (((int)uVar1 < 1) || (iVar2 = (**this->_vptr_convertable)(this,(ulong)uVar1,&ptr), iVar2 < 0))
  {
    ptr = (graph *)0x0;
  }
  return ptr;
}

Assistant:

mpt::convertable::operator T *()
{
	int type = mpt::type_properties<T *>::id(true);
	T *ptr = 0;
	if ((type <= 0) || (convert(type, &ptr) < 0)) {
		return 0;
	}
	return ptr;
}